

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommylist.h
# Opt level: O0

void tommy_list_concat(tommy_list *first,tommy_list *second)

{
  long lVar1;
  tommy_node_struct *ptVar2;
  tommy_node *ptVar3;
  tommy_node *ptVar4;
  long in_FS_OFFSET;
  tommy_node *second_head;
  tommy_node *first_tail;
  tommy_node *first_head;
  tommy_list *second_local;
  tommy_list *first_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar3 = tommy_list_head(second);
  if (ptVar3 != (tommy_node *)0x0) {
    ptVar4 = tommy_list_head(first);
    if (ptVar4 == (tommy_node *)0x0) {
      *first = *second;
    }
    else {
      ptVar2 = ptVar4->prev;
      ptVar4->prev = ptVar3->prev;
      ptVar3->prev = ptVar2;
      ptVar2->next = ptVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

tommy_inline void tommy_list_concat(tommy_list* first, tommy_list* second)
{
	tommy_node* first_head;
	tommy_node* first_tail;
	tommy_node* second_head;

	/* if the second is empty, nothing to do */
	second_head = tommy_list_head(second);
	if (second_head == 0)
		return;

	/* if the first is empty, copy the second */
	first_head = tommy_list_head(first);
	if (first_head == 0) {
		*first = *second;
		return;
	}

	/* tail of the first list */
	first_tail = first_head->prev;

	/* set the "circular" prev list */
	first_head->prev = second_head->prev;
	second_head->prev = first_tail;

	/* set the "0 terminated" next list */
	first_tail->next = second_head;
}